

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::AddLogSink(LogSink *destination)

{
  int iVar1;
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  LogSink *local_20;
  MutexLock local_18;
  
  local_18.mu_ = (Mutex *)LogDestination::sink_mutex_;
  local_20 = destination;
  if (LogDestination::sink_mutex_[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
    if (iVar1 != 0) {
      abort();
    }
  }
  this = LogDestination::sinks_;
  if (LogDestination::sinks_ == (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0
     ) {
    this = (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)operator_new(0x38);
    LogDestination::sinks_ = this;
    (this->
    super__Safe_container<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::allocator<google::LogSink_*>,___gnu_debug::_Safe_sequence,_true>
    ).
    super__Safe_sequence<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
    .super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
    (this->
    super__Safe_container<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::allocator<google::LogSink_*>,___gnu_debug::_Safe_sequence,_true>
    ).
    super__Safe_sequence<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
    .super__Safe_sequence_base._M_const_iterators = (_Safe_iterator_base *)0x0;
    (this->
    super__Safe_container<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::allocator<google::LogSink_*>,___gnu_debug::_Safe_sequence,_true>
    ).
    super__Safe_sequence<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
    .super__Safe_sequence_base._M_version = 1;
    this->super_vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> =
         (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>)
         SUB3224(ZEXT432(0) << 0x40,0);
    this->
    super__Safe_vector<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
         = (_Safe_vector<std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::__cxx1998::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
            )SUB328(ZEXT432(0) << 0x40,0x18);
  }
  std::__debug::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back
            (this,&local_20);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_18);
  return;
}

Assistant:

void AddLogSink(LogSink *destination) {
  LogDestination::AddLogSink(destination);
}